

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

SimpleString BracketsFormattedHexStringFrom(long value)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_20;
  
  StringFromFormat((char *)&local_20,"%lx");
  BracketsFormattedHexString((SimpleString *)value);
  SimpleString::deallocateInternalBuffer(&local_20);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)value;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(long value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}